

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexity.cc
# Opt level: O0

LeastSq * benchmark::MinimalLeastSq
                    (vector<int,_std::allocator<int>_> *n,
                    vector<double,_std::allocator<double>_> *time,BigOFunc *fitting_curve)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  size_type sVar4;
  code *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  LeastSq *in_RDI;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double mean;
  double fit;
  size_t i_1;
  double rms;
  double gn_i;
  size_t i;
  double sigma_time_gn;
  double sigma_time;
  double sigma_gn_squared;
  double sigma_gn;
  ulong local_58;
  double local_50;
  ulong local_40;
  double local_38;
  double local_30;
  double local_28;
  
  local_28 = 0.0;
  local_30 = 0.0;
  local_38 = 0.0;
  local_40 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
    if (sVar1 <= local_40) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,local_40);
    dVar5 = (double)(*in_RCX)(*pvVar2);
    local_28 = dVar5 * dVar5 + local_28;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,local_40);
    local_30 = *pvVar3 + local_30;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,local_40);
    local_38 = *pvVar3 * dVar5 + local_38;
    local_40 = local_40 + 1;
  }
  LeastSq::LeastSq(in_RDI);
  in_RDI->complexity = oLambda;
  in_RDI->coef = local_38 / local_28;
  local_50 = 0.0;
  local_58 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
    if (sVar1 <= local_58) break;
    dVar5 = in_RDI->coef;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,local_58);
    dVar6 = (double)(*in_RCX)(*pvVar2);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,local_58);
    dVar5 = pow(*pvVar3 - dVar5 * dVar6,2.0);
    local_50 = dVar5 + local_50;
    local_58 = local_58 + 1;
  }
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  auVar7._8_4_ = (int)(sVar1 >> 0x20);
  auVar7._0_8_ = sVar1;
  auVar7._12_4_ = 0x45300000;
  sVar4 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  auVar8._8_4_ = (int)(sVar4 >> 0x20);
  auVar8._0_8_ = sVar4;
  auVar8._12_4_ = 0x45300000;
  dVar5 = sqrt(local_50 /
               ((auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)));
  in_RDI->rms = dVar5 / (local_30 /
                        ((auVar7._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)));
  return in_RDI;
}

Assistant:

LeastSq MinimalLeastSq(const std::vector<int>& n,
                       const std::vector<double>& time,
                       BigOFunc* fitting_curve) {
  double sigma_gn = 0.0;
  double sigma_gn_squared = 0.0;
  double sigma_time = 0.0;
  double sigma_time_gn = 0.0;

  // Calculate least square fitting parameter
  for (size_t i = 0; i < n.size(); ++i) {
    double gn_i = fitting_curve(n[i]);
    sigma_gn += gn_i;
    sigma_gn_squared += gn_i * gn_i;
    sigma_time += time[i];
    sigma_time_gn += time[i] * gn_i;
  }

  LeastSq result;
  result.complexity = oLambda;

  // Calculate complexity.
  result.coef = sigma_time_gn / sigma_gn_squared;

  // Calculate RMS
  double rms = 0.0;
  for (size_t i = 0; i < n.size(); ++i) {
    double fit = result.coef * fitting_curve(n[i]);
    rms += pow((time[i] - fit), 2);
  }

  // Normalized RMS by the mean of the observed values
  double mean = sigma_time / n.size();
  result.rms = sqrt(rms / n.size()) / mean;

  return result;
}